

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx2.cpp
# Opt level: O1

void __thiscall
ncnn::InnerProduct_x86_avx2::InnerProduct_x86_avx2(InnerProduct_x86_avx2 *this,void **vtt)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [16];
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_InnerProduct_x86_avx2 = pp_Var1;
  *(void **)((long)&this->_vptr_InnerProduct_x86_avx2 + (long)pp_Var1[-3]) = vtt[1];
  *(undefined8 *)((long)&(this->weight_data_packed).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_packed).elemsize + 4) = 0;
  (this->weight_data_packed).data = (void *)0x0;
  (this->weight_data_packed).refcount = (int *)0x0;
  (this->weight_data_packed).allocator = (Allocator *)0x0;
  (this->weight_data_packed).dims = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).h = 0;
  (this->weight_data_packed).d = 0;
  (this->weight_data_packed).c = 0;
  (this->weight_data_fp16).allocator = (Allocator *)0x0;
  (this->weight_data_fp16).dims = 0;
  (this->weight_data_fp16).w = 0;
  (this->weight_data_fp16).w = 0;
  (this->weight_data_fp16).h = 0;
  (this->weight_data_fp16).d = 0;
  (this->weight_data_fp16).c = 0;
  (this->weight_data_int8).allocator = (Allocator *)0x0;
  (this->weight_data_int8).dims = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).h = 0;
  (this->weight_data_int8).d = 0;
  (this->weight_data_int8).c = 0;
  (this->scales_in).cstep = 0;
  (this->scales_in).allocator = (Allocator *)0x0;
  (this->scales_in).dims = 0;
  (this->scales_in).w = 0;
  (this->scales_in).w = 0;
  (this->scales_in).h = 0;
  (this->scales_in).d = 0;
  (this->scales_in).c = 0;
  auVar2 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])&(this->weight_data_packed).cstep = ZEXT1632(auVar2);
  (this->weight_data_fp16).elempack = 0;
  *(undefined1 (*) [32])&(this->weight_data_fp16).cstep = ZEXT1632(auVar2);
  (this->weight_data_int8).elempack = 0;
  *(undefined1 (*) [32])&(this->weight_data_int8).cstep = ZEXT1632(auVar2);
  (this->scales_in).elempack = 0;
  pp_Var1 = this->_vptr_InnerProduct_x86_avx2;
  *(code *)((long)&this->flatten + (long)(pp_Var1[-3] + 3)) = (code)0x1;
  *(code *)((long)&this->activation + (long)(pp_Var1[-3] + 1)) = (code)0x1;
  this->flatten = (Layer *)0x0;
  this->activation = (Layer *)0x0;
  return;
}

Assistant:

InnerProduct_x86_avx2::InnerProduct_x86_avx2()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__

    flatten = 0;
    activation = 0;
}